

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O2

void print_usage(void)

{
  puts(
      "OpenELP - Open EchoLink Proxy 0.9.4-dev\n\nUsage: openelpd [OPTION...] [CONFIG FILE]\n\nOptions:\n  -d, --debug    Enable debugging output\n  -F             Stay in foreground (don\'t daemonize)\n  -h, --help     Display this help\n  -L <log path>  Log output the given log file\n  -q, --quiet    Suppress messages to stdout\n  -S             Use syslog for logging\n  -V, --version  Display version and exit\n"
      );
  return;
}

Assistant:

static void print_usage(void)
{
	printf("OpenELP - Open EchoLink Proxy " OCH_STR2(OPENELP_VERSION) "\n\n"
	       "Usage: openelpd [OPTION...] [CONFIG FILE]\n\n"
	       "Options:\n"
	       "  -d, --debug    Enable debugging output\n"
#ifdef HAVE_EVENTLOG
	       "  -E             Use Event Log for logging\n"
#endif
#ifndef _WIN32
	       "  -F             Stay in foreground (don't daemonize)\n"
#endif
	       "  -h, --help     Display this help\n"
	       "  -L <log path>  Log output the given log file\n"
	       "  -q, --quiet    Suppress messages to stdout\n"
#ifdef HAVE_SYSLOG
	       "  -S             Use syslog for logging\n"
#endif
	       "  -V, --version  Display version and exit\n"
#ifndef _WIN32
	       "\n"
#endif
	       );
}